

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intra_pred.c
# Opt level: O3

void tscpm_linear_transform
               (pel *pSrc,int iSrcStride,pel *pDst,int iDstStride,int a_u,int b_u,int a_v,int b_v,
               int iShift,int uiWidth,int uiHeight,int bitDept)

{
  int iVar1;
  long lVar2;
  byte bVar3;
  int iVar4;
  uint uVar5;
  ulong uVar6;
  uint uVar7;
  byte bVar8;
  uint uVar9;
  uint uVar10;
  byte bVar11;
  
  if (0 < uiHeight) {
    bVar11 = 0;
    bVar3 = (byte)iShift;
    if (iShift < 1) {
      bVar3 = bVar11;
    }
    uVar10 = ~(-1 << ((byte)bitDept & 0x1f));
    iVar1 = 0;
    do {
      if (0 < uiWidth) {
        iVar4 = 1;
        lVar2 = 0;
        uVar6 = 0;
        do {
          uVar7 = (int)((long)((ulong)pSrc[uVar6] * (long)a_u) >> (bVar3 & 0x3f)) + b_u;
          uVar9 = uVar7;
          if ((int)uVar10 <= (int)uVar7) {
            uVar9 = uVar10;
          }
          uVar5 = (int)((long)((ulong)pSrc[uVar6] * (long)a_v) >> (bVar3 & 0x3f)) + b_v;
          bVar8 = (byte)uVar9;
          if ((int)uVar7 < 0) {
            bVar8 = bVar11;
          }
          pDst[lVar2 >> 0x20] = bVar8;
          uVar9 = uVar5;
          if ((int)uVar10 <= (int)uVar5) {
            uVar9 = uVar10;
          }
          bVar8 = (byte)uVar9;
          if ((int)uVar5 < 0) {
            bVar8 = bVar11;
          }
          pDst[iVar4] = bVar8;
          uVar6 = uVar6 + 1;
          iVar4 = iVar4 + 2;
          lVar2 = lVar2 + 0x200000000;
        } while ((uint)uiWidth != uVar6);
      }
      pDst = pDst + iDstStride;
      pSrc = pSrc + iSrcStride;
      iVar1 = iVar1 + 1;
    } while (iVar1 != uiHeight);
  }
  return;
}

Assistant:

void tscpm_linear_transform(pel *pSrc, int iSrcStride, pel *pDst, int iDstStride, int a_u, int b_u, int a_v, int b_v, int iShift, int uiWidth, int uiHeight, int bitDept)
{
    int maxResult = (1 << bitDept) - 1;

    iShift = (iShift >= 0 ? iShift : 0);

    for (int j = 0; j < uiHeight; j++)
    {
        for (int i = 0; i < uiWidth; i++)
        {
            int i2 = i << 1;
            int tempValue_u = (((s64)a_u * pSrc[i]) >> iShift) + b_u;
            int tempValue_v = (((s64)a_v * pSrc[i]) >> iShift) + b_v;
            pDst[i2    ] = COM_CLIP3(0, maxResult, tempValue_u);
            pDst[i2 + 1] = COM_CLIP3(0, maxResult, tempValue_v);
        }
        pDst += iDstStride;
        pSrc += iSrcStride;
    }
}